

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_pake_parse_serverhello
               (SSL_HANDSHAKE *hs,Array<unsigned_char> *out_secret,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  pointer psVar4;
  pointer this;
  Span<const_unsigned_char> peer_share;
  Span<const_unsigned_char> local_f8;
  undefined1 local_e8 [8];
  Array<unsigned_char> secret;
  Span<unsigned_char> local_b8;
  Span<unsigned_char> local_a8;
  uchar local_98 [8];
  uint8_t prover_secret [32];
  uint8_t prover_confirm [32];
  Span<const_unsigned_char> pake_msg_span;
  undefined1 local_40 [6];
  uint16_t named_pake;
  CBS pake_msg;
  CBS *contents_local;
  uint8_t *out_alert_local;
  Array<unsigned_char> *out_secret_local;
  SSL_HANDSHAKE *hs_local;
  
  *out_alert = '2';
  pake_msg.len = (size_t)contents;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs->pake_prover);
  if (bVar1) {
    iVar2 = CBS_get_u16((CBS *)pake_msg.len,(uint16_t *)((long)&pake_msg_span.size_ + 6));
    if ((((iVar2 != 0) &&
         (iVar2 = CBS_get_u16_length_prefixed((CBS *)pake_msg.len,(CBS *)local_40), iVar2 != 0)) &&
        (sVar3 = CBS_len((CBS *)pake_msg.len), sVar3 == 0)) && (pake_msg_span.size_._6_2_ == 0x7d96)
       ) {
      sVar3 = CBS_len((CBS *)local_40);
      if (sVar3 != 0x61) {
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc64);
        *out_alert = '/';
        return false;
      }
      join_0x00000010_0x00000000_ = cbs_st::operator_cast_to_Span((cbs_st *)local_40);
      psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                         (&hs->credential);
      bVar1 = ssl_credential_st::HasPAKEAttempts(psVar4);
      if (!bVar1) {
        ERR_put_error(0x10,0,0x145,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc6d);
        *out_alert = 'P';
        return false;
      }
      this = std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::operator->
                       (&hs->pake_prover);
      Span<unsigned_char>::Span<32ul>(&local_a8,(uchar (*) [32])(prover_secret + 0x18));
      Span<unsigned_char>::Span<32ul>(&local_b8,(uchar (*) [32])local_98);
      peer_share = Span<const_unsigned_char>::subspan
                             ((Span<const_unsigned_char> *)(prover_confirm + 0x18),0,0x41);
      join_0x00000010_0x00000000_ =
           Span<const_unsigned_char>::subspan
                     ((Span<const_unsigned_char> *)(prover_confirm + 0x18),0x41,0xffffffffffffffff);
      bVar1 = spake2plus::Prover::ComputeConfirmation
                        (this,local_a8,local_b8,peer_share,join_0x00000010_0x00000000_);
      if (!bVar1) {
        psVar4 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->
                           (&hs->credential);
        ssl_credential_st::ClaimPAKEAttempt(psVar4);
        ERR_put_error(0x10,0,0x89,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc7a);
        *out_alert = '/';
        return false;
      }
      Array<unsigned_char>::Array((Array<unsigned_char> *)local_e8);
      Span<unsigned_char_const>::Span<32ul>
                ((Span<unsigned_char_const> *)&local_f8,(uchar (*) [32])local_98);
      bVar1 = Array<unsigned_char>::CopyFrom((Array<unsigned_char> *)local_e8,local_f8);
      if (bVar1) {
        Array<unsigned_char>::operator=(out_secret,(Array<unsigned_char> *)local_e8);
      }
      else {
        ERR_put_error(0x10,0,0x44,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0xc81);
        *out_alert = 'P';
      }
      Array<unsigned_char>::~Array((Array<unsigned_char> *)local_e8);
      return bVar1;
    }
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xc5d);
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xc52);
    *out_alert = 'P';
  }
  return false;
}

Assistant:

bool ssl_ext_pake_parse_serverhello(SSL_HANDSHAKE *hs,
                                    Array<uint8_t> *out_secret,
                                    uint8_t *out_alert, CBS *contents) {
  *out_alert = SSL_AD_DECODE_ERROR;

  if (!hs->pake_prover) {
    // If we did not offer a PAKE, the extension should have been rejected as
    // unsolicited.
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  CBS pake_msg;
  uint16_t named_pake;
  if (!CBS_get_u16(contents, &named_pake) ||
      !CBS_get_u16_length_prefixed(contents, &pake_msg) ||
      CBS_len(contents) != 0 ||  //
      named_pake != SSL_PAKE_SPAKE2PLUSV1) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  // Check that the server's PAKE share consists of the right number of
  // bytes for a PAKE share and a key confirmation message.
  if (CBS_len(&pake_msg) != spake2plus::kShareSize + spake2plus::kConfirmSize) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }
  Span<const uint8_t> pake_msg_span = pake_msg;

  // Releasing the result of |ComputeConfirmation| lets the client confirm one
  // PAKE guess. If all failures are used up, no more guesses are allowed.
  if (!hs->credential->HasPAKEAttempts()) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_PAKE_EXHAUSTED);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  uint8_t prover_confirm[spake2plus::kConfirmSize];
  uint8_t prover_secret[spake2plus::kSecretSize];
  if (!hs->pake_prover->ComputeConfirmation(
          prover_confirm, prover_secret,
          pake_msg_span.subspan(0, spake2plus::kShareSize),
          pake_msg_span.subspan(spake2plus::kShareSize))) {
    // Record a failure before releasing the answer to the client.
    hs->credential->ClaimPAKEAttempt();
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  Array<uint8_t> secret;
  if (!secret.CopyFrom(prover_secret)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  *out_secret = std::move(secret);
  return true;
}